

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

void msg_flush(wchar_t x)

{
  uint8_t a;
  wchar_t x_local;
  
  Term_putstr(x,L'\0',L'\xffffffff',L'\x0e',"-more-");
  if ((((player->opts).opt[0x11] & 1U) == 0) && ((keymap_auto_more & 1U) == 0)) {
    anykey();
  }
  Term_erase(L'\0',L'\0',L'ÿ');
  return;
}

Assistant:

static void msg_flush(int x)
{
	uint8_t a = COLOUR_L_BLUE;

	/* Pause for response */
	Term_putstr(x, 0, -1, a, "-more-");

	if ((!OPT(player, auto_more)) && !keymap_auto_more)
		anykey();

	/* Clear the line */
	Term_erase(0, 0, 255);
}